

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O1

void done_eating(boolean message)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  obj *poVar4;
  boolean bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  
  *(uint *)&(victual.piece)->field_0x4a = *(uint *)&(victual.piece)->field_0x4a | 0x800000;
  occupation = (_func_int *)0x0;
  newuhs('\0');
  if (nomovemsg == (char *)0x0) {
    if (message != '\0') {
      pcVar10 = "draining";
      if ((*(uint *)&(victual.piece)->field_0x4a >> 0x1b & 1) == 0) {
        pcVar10 = "eating";
      }
      pcVar9 = food_xname(victual.piece,'\x01');
      pline("You finish %s %s.",pcVar10,pcVar9);
    }
  }
  else {
    if (message != '\0') {
      pline(nomovemsg);
    }
    nomovemsg = (char *)0x0;
  }
  poVar4 = victual.piece;
  uVar2 = (victual.piece)->otyp;
  if (uVar2 < 0x11b) {
    if (uVar2 == 0x10e) {
      if ((((victual.piece)->field_0x4d & 8) == 0) ||
         ((urace.malenum == 0xe8 && (uVar8 = mt_random(), uVar8 * -0x33333333 < 0x33333334)))) {
        cpostfx((victual.piece)->corpsenm);
      }
    }
    else if (uVar2 == 0x10f) {
      if ((((((victual.piece)->corpsenm == 0xc) || ((victual.piece)->corpsenm == 0xb)) &&
           (u.uprops[8].extrinsic == 0)) && (((byte)youmonst.mintrinsics & 0x80) == 0)) &&
         ((bVar5 = poly_when_stoned(youmonst.data), bVar5 == '\0' ||
          (iVar7 = polymon(0x108), iVar7 == 0)))) {
        if (u.uprops[0x21].intrinsic == 0) {
          u.uprops[0x21].intrinsic = 5;
        }
        killer_format = 0;
        pcVar10 = mons_mname(mons + poVar4->corpsenm);
        sprintf(killer_buf,"%s egg",pcVar10);
        delayed_killer = killer_buf;
      }
    }
    else if (uVar2 == 0x115) {
      if ((u.uprops[0x1d].intrinsic != 0) && (((victual.piece)->field_0x4a & 1) == 0)) {
        make_sick(0,(char *)0x0,'\x01',3);
      }
      if ((u.uprops[0x2f].intrinsic != 0) && ((poVar4->field_0x4a & 1) == 0)) {
        make_vomiting(0,'\x01');
      }
    }
  }
  else {
    switch(uVar2) {
    case 0x11b:
      make_blinded((ulong)u.ucreamed,'\x01');
      break;
    case 0x11c:
      if ((-1 < u.ulycn) || (((youmonst.data)->mflags2 & 4) != 0)) {
        you_unwere('\x01');
      }
      break;
    case 0x11f:
      gainstr(victual.piece,1,'\0');
      iVar3 = u.umonnum;
      iVar7 = u.umonster;
      bVar1 = poVar4->field_0x4a;
      uVar6 = mt_random();
      uVar8 = uVar6 + 1 + (uVar6 / 0x14) * -0x14;
      if ((bVar1 & 1) != 0) {
        uVar8 = ~(uVar6 % 0x14);
      }
      if (iVar3 == iVar7) {
        u.uhp = uVar8 + u.uhp;
        if (u.uhpmax < u.uhp) {
          uVar8 = mt_random();
          if (uVar8 * -0xf0f0f0f < 0xf0f0f10) {
            u.uhpmax = u.uhpmax + 1;
          }
          u.uhp = u.uhpmax;
        }
        else if (u.uhp < 1) {
          killer_format = 0;
          killer = "rotten lump of royal jelly";
          done(2);
        }
      }
      else {
        u.mh = uVar8 + u.mh;
        if (u.mhmax < u.mh) {
          uVar8 = mt_random();
          if (uVar8 * -0xf0f0f0f < 0xf0f0f10) {
            u.mhmax = u.mhmax + 1;
          }
          u.mh = u.mhmax;
        }
        else if (u.mh < 1) {
          rehumanize();
        }
      }
      if ((poVar4->field_0x4a & 1) == 0) {
        heal_legs();
      }
      break;
    case 0x122:
      if (u.roleplay.illiterate == '\0') {
        iVar7 = bcsign(victual.piece);
        outrumor(iVar7,1);
        if (((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
          violated(8);
        }
      }
      else {
        pline("This cookie has a scrap of paper inside.");
        pline("What a pity that you cannot read!");
      }
    }
  }
  if ((*(uint *)&(victual.piece)->field_0x4a >> 0x1b & 1) == 0) {
    if ((victual.piece)->where == '\x03') {
      useup(victual.piece);
    }
    else {
      useupf(victual.piece,1);
    }
  }
  else {
    *(uint *)&(victual.piece)->field_0x4a = *(uint *)&(victual.piece)->field_0x4a & 0xff7fffff;
  }
  victual.piece = (obj *)0x0;
  victual._20_1_ = victual._20_1_ & 0xf1;
  return;
}

Assistant:

static void done_eating(boolean message)
{
	victual.piece->in_use = TRUE;
	occupation = 0; /* do this early, so newuhs() knows we're done */
	newuhs(FALSE);
	if (nomovemsg) {
		if (message) pline(nomovemsg);
		nomovemsg = 0;
	} else if (message)
		pline("You finish %s %s.",
		      victual.piece->odrained ? "draining" : "eating",
		      food_xname(victual.piece, TRUE));

	if (victual.piece->otyp == CORPSE) {
		if (!victual.piece->odrained || (Race_if(PM_VAMPIRE) && !rn2(5)))
			cpostfx(victual.piece->corpsenm);
	} else {
		fpostfx(victual.piece);
	}

	if (victual.piece->odrained)
		victual.piece->in_use = FALSE;
	else if (carried(victual.piece))
		useup(victual.piece);
	else
		useupf(victual.piece, 1L);
	victual.piece = NULL;
	victual.fullwarn = victual.eating = victual.doreset = FALSE;
}